

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O3

int __thiscall
Fl_Check_Browser_Type::textstuff(Fl_Check_Browser_Type *this,int w,Fl_Font *f,int *s,Fl_Color *c)

{
  Fl_Type *pFVar1;
  
  if (w == 4) {
    this = (Fl_Check_Browser_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.factory;
  }
  if ((uint)w < 5) {
    pFVar1 = ((Fl_Type *)((long)this + 0x78))->prev;
    switch(w) {
    default:
      *f = *(Fl_Font *)&pFVar1[1].rtti;
      *s = pFVar1[1].level;
      *c = *(Fl_Color *)&pFVar1[1].field_0x4c;
      break;
    case 1:
      *(Fl_Font *)&pFVar1[1].rtti = *f;
      break;
    case 2:
      pFVar1[1].level = *s;
      break;
    case 3:
      *(Fl_Color *)&pFVar1[1].field_0x4c = *c;
    }
  }
  return 1;
}

Assistant:

int Fl_Check_Browser_Type::textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
  Fl_Check_Browser *myo = (Fl_Check_Browser*)(w==4 ? ((Fl_Widget_Type*)factory)->o : o);
  switch (w) {
    case 4:
    case 0: f = myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
  }
  return 1;
}